

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::AllowNativeCodeBumpAllocation(Recycler *this)

{
  byte bVar1;
  
  if ((this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) && (this->verifyEnabled == false)
     ) {
    bVar1 = this->isPageHeapEnabled ^ 1;
  }
  else {
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

bool Recycler::AllowNativeCodeBumpAllocation()
{
    // In debug builds, if we need to track allocation info, we pretend there is no pointer-bump-allocation space
    // on this page, so that we always fail the check in native code and go to helper, which does the tracking.
#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        return false;
    }
#endif

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->verifyEnabled)
    {
        return false;
    }
#endif

#ifdef RECYCLER_PAGE_HEAP
    // Don't allow bump allocation in the JIT when page heap is turned on
    if (this->IsPageHeapEnabled())
    {
        return false;
    }
#endif

    return true;
}